

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O3

void __thiscall ADL_JavaOPL3::OPL3::initChannels2op(OPL3 *this)

{
  Operator *pOVar1;
  Operator *pOVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  Channel2op *pCVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  lVar9 = 0;
  memset(this->channels2op,0,0x90);
  if (this->FullPan == false) {
    uVar11 = 0;
    uVar12 = 0x3ff00000;
  }
  else {
    uVar11 = 0x667e556e;
    uVar12 = 0x3fe6a09e;
  }
  dVar3 = (double)CONCAT44(uVar12,uVar11);
  bVar6 = true;
  do {
    bVar8 = bVar6;
    iVar4 = (int)lVar9 * 0x100;
    lVar10 = 0;
    do {
      pCVar7 = (Channel2op *)operator_new(0x60);
      pOVar1 = this->operators[lVar9][lVar10];
      pOVar2 = this->operators[lVar9][lVar10 + 3];
      iVar5 = (int)lVar10;
      (pCVar7->super_Channel).channelBaseAddress = iVar4 + iVar5;
      (pCVar7->super_Channel).feedback[0] = 0.0;
      (pCVar7->super_Channel).feedback[1] = 0.0;
      (pCVar7->super_Channel).fnuml = 0;
      (pCVar7->super_Channel).fnumh = 0;
      (pCVar7->super_Channel).kon = 0;
      (pCVar7->super_Channel).block = 0;
      (pCVar7->super_Channel).fb = 0;
      (pCVar7->super_Channel).cha = 0;
      (pCVar7->super_Channel).chb = 0;
      (pCVar7->super_Channel).cnt = 0;
      (pCVar7->super_Channel).rightPan = dVar3;
      (pCVar7->super_Channel).leftPan = dVar3;
      (pCVar7->super_Channel)._vptr_Channel = (_func_int **)&PTR__Channel_00218920;
      pCVar7->op1 = pOVar1;
      pCVar7->op2 = pOVar2;
      this->channels2op[lVar9][lVar10] = pCVar7;
      pCVar7 = (Channel2op *)operator_new(0x60);
      pOVar1 = this->operators[lVar9][lVar10 + 8];
      pOVar2 = this->operators[lVar9][lVar10 + 0xb];
      (pCVar7->super_Channel).channelBaseAddress = iVar4 + iVar5 + 3;
      (pCVar7->super_Channel).feedback[0] = 0.0;
      (pCVar7->super_Channel).feedback[1] = 0.0;
      (pCVar7->super_Channel).fnuml = 0;
      (pCVar7->super_Channel).fnumh = 0;
      (pCVar7->super_Channel).kon = 0;
      (pCVar7->super_Channel).block = 0;
      (pCVar7->super_Channel).fb = 0;
      (pCVar7->super_Channel).cha = 0;
      (pCVar7->super_Channel).chb = 0;
      (pCVar7->super_Channel).cnt = 0;
      (pCVar7->super_Channel).rightPan = dVar3;
      (pCVar7->super_Channel).leftPan = dVar3;
      (pCVar7->super_Channel)._vptr_Channel = (_func_int **)&PTR__Channel_00218920;
      pCVar7->op1 = pOVar1;
      pCVar7->op2 = pOVar2;
      this->channels2op[lVar9][lVar10 + 3] = pCVar7;
      pCVar7 = (Channel2op *)operator_new(0x60);
      pOVar1 = this->operators[lVar9][lVar10 + 0x10];
      pOVar2 = this->operators[lVar9][lVar10 + 0x13];
      (pCVar7->super_Channel).channelBaseAddress = iVar4 + 6 + iVar5;
      (pCVar7->super_Channel).feedback[0] = 0.0;
      (pCVar7->super_Channel).feedback[1] = 0.0;
      (pCVar7->super_Channel).fnuml = 0;
      (pCVar7->super_Channel).fnumh = 0;
      (pCVar7->super_Channel).kon = 0;
      (pCVar7->super_Channel).block = 0;
      (pCVar7->super_Channel).fb = 0;
      (pCVar7->super_Channel).cha = 0;
      (pCVar7->super_Channel).chb = 0;
      (pCVar7->super_Channel).cnt = 0;
      (pCVar7->super_Channel).rightPan = dVar3;
      (pCVar7->super_Channel).leftPan = dVar3;
      (pCVar7->super_Channel)._vptr_Channel = (_func_int **)&PTR__Channel_00218920;
      pCVar7->op1 = pOVar1;
      pCVar7->op2 = pOVar2;
      this->channels2op[lVar9][lVar10 + 6] = pCVar7;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar9 = 1;
    bVar6 = false;
  } while (bVar8);
  return;
}

Assistant:

void OPL3::initChannels2op() {
    // The YMF262 has 18 2-op channels.
    // Each 2-op channel can be at a serial or parallel operator configuration:
    memset(channels2op, 0, sizeof(channels2op));
	double startvol = FullPan ? CENTER_PANNING_POWER : 1;
    for(int array=0; array<2; array++)
        for(int channelNumber=0; channelNumber<3; channelNumber++) {
            int baseAddress = (array<<8) | channelNumber;
            // Channels 1, 2, 3 -> Operator offsets 0x0,0x3; 0x1,0x4; 0x2,0x5
            channels2op[array][channelNumber]   = new Channel2op(baseAddress, startvol, operators[array][channelNumber], operators[array][channelNumber+0x3]);
            // Channels 4, 5, 6 -> Operator offsets 0x8,0xB; 0x9,0xC; 0xA,0xD
            channels2op[array][channelNumber+3] = new Channel2op(baseAddress+3, startvol, operators[array][channelNumber+0x8], operators[array][channelNumber+0xB]);
            // Channels 7, 8, 9 -> Operators 0x10,0x13; 0x11,0x14; 0x12,0x15
            channels2op[array][channelNumber+6] = new Channel2op(baseAddress+6, startvol, operators[array][channelNumber+0x10], operators[array][channelNumber+0x13]);
        }   
}